

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_navigator.cc
# Opt level: O3

ReadResult __thiscall
absl::lts_20250127::cord_internal::CordRepBtreeNavigator::Read
          (CordRepBtreeNavigator *this,size_t edge_offset,size_t n)

{
  RefcountAndFlags *pRVar1;
  uint uVar2;
  byte bVar3;
  bool bVar4;
  CordRep *pCVar5;
  ulong uVar6;
  CordRep *pCVar7;
  size_t sVar8;
  uint8_t uVar9;
  ulong n_00;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  CordRepBtree *rep;
  long lVar13;
  CordRepBtree *pCVar14;
  ReadResult RVar15;
  CordRep *local_50;
  
  bVar3 = this->index_[0];
  uVar10 = (ulong)bVar3;
  pCVar14 = this->node_[0];
  if (bVar3 < (pCVar14->super_CordRep).storage[1]) {
LAB_003705b6:
    __assert_fail("index >= begin()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                  ,0x268,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
  }
  if ((pCVar14->super_CordRep).storage[2] <= bVar3) {
LAB_00370597:
    __assert_fail("index < end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                  ,0x269,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
  }
  pCVar7 = pCVar14->edges_[uVar10];
  uVar12 = pCVar7->length;
  if (uVar12 < edge_offset || uVar12 - edge_offset == 0) {
    __assert_fail("edge_offset < edge->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.cc"
                  ,0x72,
                  "ReadResult absl::cord_internal::CordRepBtreeNavigator::Read(size_t, size_t)");
  }
  n_00 = n + edge_offset;
  if (n_00 < uVar12) {
    local_50 = anon_unknown_10::Substring(pCVar7,edge_offset,n);
  }
  else {
    pCVar5 = anon_unknown_10::Substring(pCVar7,edge_offset,uVar12 - edge_offset);
    local_50 = (CordRep *)operator_new(0x40);
    (local_50->refcount).count_.super___atomic_base<int>._M_i = 2;
    uVar12 = 0;
    uVar9 = '\0';
    if (pCVar5->tag == '\x03') {
      uVar9 = pCVar5->storage[0] + '\x01';
    }
    local_50->length = pCVar5->length;
    local_50->tag = '\x03';
    local_50->storage[0] = uVar9;
    local_50->storage[1] = '\0';
    local_50->storage[2] = '\x01';
    local_50[1].length = (size_t)pCVar5;
    sVar8 = pCVar7->length;
    lVar13 = 1;
    do {
      n_00 = n_00 - sVar8;
      uVar10 = uVar10 + 1;
      uVar6 = (ulong)(pCVar14->super_CordRep).storage[2];
      if (uVar10 == uVar6) {
        uVar12 = (ulong)(int)uVar12;
        do {
          this->index_[uVar12] = (uint8_t)uVar10;
          if ((long)this->height_ <= (long)uVar12) {
            local_50->storage[2] = (uint8_t)lVar13;
            if (n_00 == 0) {
              n_00 = 0;
            }
            else {
              LOCK();
              pRVar1 = &local_50->refcount;
              uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
              (pRVar1->count_).super___atomic_base<int>._M_i =
                   (pRVar1->count_).super___atomic_base<int>._M_i + -2;
              UNLOCK();
              if ((uVar2 & 1) == 0 && (int)uVar2 < 1) {
                __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                              ,0xac,
                              "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()"
                             );
              }
              if (uVar2 == 2) {
                CordRep::Destroy(local_50);
              }
              local_50 = (CordRep *)0x0;
            }
            goto LAB_00370541;
          }
          pCVar7 = local_50;
          if (n_00 != 0) {
            local_50->storage[2] = (uint8_t)lVar13;
            pCVar7 = (CordRep *)operator_new(0x40);
            (pCVar7->refcount).count_.super___atomic_base<int>._M_i = 2;
            if (local_50->tag == '\x03') {
              uVar9 = local_50->storage[0] + '\x01';
            }
            else {
              uVar9 = '\0';
            }
            pCVar7->length = local_50->length;
            pCVar7->tag = '\x03';
            pCVar7->storage[0] = uVar9;
            pCVar7->storage[1] = '\0';
            pCVar7->storage[2] = '\x01';
            pCVar7[1].length = (size_t)local_50;
            lVar13 = 1;
          }
          pCVar14 = this->node_[uVar12 + 1];
          uVar10 = (ulong)this->index_[uVar12 + 1] + 1;
          uVar6 = (ulong)(pCVar14->super_CordRep).storage[2];
          uVar12 = uVar12 + 1;
          local_50 = pCVar7;
        } while (uVar10 == uVar6);
      }
      if (uVar10 < (pCVar14->super_CordRep).storage[1]) goto LAB_003705b6;
      if (uVar6 <= uVar10) goto LAB_00370597;
      rep = (CordRepBtree *)pCVar14->edges_[uVar10];
      sVar8 = (rep->super_CordRep).length;
      if (sVar8 <= n_00) {
        local_50->length = local_50->length + sVar8;
        LOCK();
        pRVar1 = &(rep->super_CordRep).refcount;
        (pRVar1->count_).super___atomic_base<int>._M_i =
             (pRVar1->count_).super___atomic_base<int>._M_i + 2;
        UNLOCK();
        *(CordRepBtree **)(local_50[1].storage + lVar13 * 8 + -0xd) = rep;
        lVar13 = lVar13 + 1;
        sVar8 = (rep->super_CordRep).length;
      }
    } while (sVar8 <= n_00);
    local_50->length = local_50->length + n_00;
    pCVar7 = local_50;
    if (0 < (int)uVar12) {
      pCVar5 = local_50;
      uVar12 = uVar12 & 0xffffffff;
      pCVar14 = rep;
      do {
        if ((pCVar14->super_CordRep).tag != '\x03') {
          __assert_fail("IsBtree()",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                        ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
        }
        this->index_[uVar12] = (uint8_t)uVar10;
        this->node_[uVar12 - 1] = pCVar14;
        bVar3 = (pCVar14->super_CordRep).storage[1];
        uVar10 = (ulong)bVar3;
        if ((pCVar14->super_CordRep).storage[2] <= bVar3) goto LAB_00370597;
        rep = (CordRepBtree *)pCVar14->edges_[uVar10];
        if (n_00 == 0) {
          n_00 = 0;
          pCVar7 = pCVar5;
        }
        else {
          pCVar7 = (CordRep *)operator_new(0x40);
          (pCVar7->refcount).count_.super___atomic_base<int>._M_i = 2;
          pCVar7->tag = '\x03';
          pCVar7->storage[0] = (uint8_t)(uVar12 - 1);
          pCVar7->storage[1] = '\0';
          pCVar7->storage[2] = '\0';
          pCVar7->length = n_00;
          *(CordRep **)(pCVar5[1].storage + lVar13 * 8 + -0xd) = pCVar7;
          pCVar5->storage[2] = (char)lVar13 + '\x01';
          uVar6 = (rep->super_CordRep).length;
          if (n_00 < uVar6) {
            lVar13 = 0;
          }
          else {
            lVar13 = 0;
            do {
              LOCK();
              pRVar1 = &(rep->super_CordRep).refcount;
              (pRVar1->count_).super___atomic_base<int>._M_i =
                   (pRVar1->count_).super___atomic_base<int>._M_i + 2;
              UNLOCK();
              *(CordRepBtree **)(pCVar7[1].storage + lVar13 * 8 + -0xd) = rep;
              uVar11 = lVar13 + 1 + uVar10;
              if (uVar11 < (pCVar14->super_CordRep).storage[1]) goto LAB_003705b6;
              if ((pCVar14->super_CordRep).storage[2] <= uVar11) goto LAB_00370597;
              n_00 = n_00 - uVar6;
              rep = (CordRepBtree *)pCVar14->edges_[uVar10 + lVar13 + 1];
              uVar6 = (rep->super_CordRep).length;
              lVar13 = lVar13 + 1;
            } while (uVar6 <= n_00);
            uVar10 = uVar10 + lVar13;
          }
        }
        bVar4 = 1 < (long)uVar12;
        pCVar5 = pCVar7;
        uVar12 = uVar12 - 1;
        pCVar14 = rep;
      } while (bVar4);
    }
    if (n_00 != 0) {
      pCVar5 = anon_unknown_10::Substring(&rep->super_CordRep,0,n_00);
      *(CordRep **)(pCVar7[1].storage + lVar13 * 8 + -0xd) = pCVar5;
      lVar13 = lVar13 + 1;
    }
    pCVar7->storage[2] = (uint8_t)lVar13;
    this->index_[0] = (uint8_t)uVar10;
  }
LAB_00370541:
  RVar15.n = n_00;
  RVar15.tree = local_50;
  return RVar15;
}

Assistant:

ReadResult CordRepBtreeNavigator::Read(size_t edge_offset, size_t n) {
  int height = 0;
  size_t length = edge_offset + n;
  size_t index = index_[0];
  CordRepBtree* node = node_[0];
  CordRep* edge = node->Edge(index);
  assert(edge_offset < edge->length);

  if (length < edge->length) {
    return {Substring(edge, edge_offset, n), length};
  }

  // Similar to 'Skip', we consume all edges that are inside the 'length' of
  // data that needs to be read. If we exhaust the current level, we move one
  // level up the tree and repeat until we hit the final edge that must be
  // (partially) read. We consume all edges into `subtree`.
  CordRepBtree* subtree = CordRepBtree::New(Substring(edge, edge_offset));
  size_t subtree_end = 1;
  do {
    length -= edge->length;
    while (++index == node->end()) {
      index_[height] = static_cast<uint8_t>(index);
      if (++height > height_) {
        subtree->set_end(subtree_end);
        if (length == 0) return {subtree, 0};
        CordRep::Unref(subtree);
        return {nullptr, length};
      }
      if (length != 0) {
        subtree->set_end(subtree_end);
        subtree = CordRepBtree::New(subtree);
        subtree_end = 1;
      }
      node = node_[height];
      index = index_[height];
    }
    edge = node->Edge(index);
    if (length >= edge->length) {
      subtree->length += edge->length;
      subtree->edges_[subtree_end++] = CordRep::Ref(edge);
    }
  } while (length >= edge->length);
  CordRepBtree* tree = subtree;
  subtree->length += length;

  // If we moved up the tree, descend down to the leaf level, consuming all
  // edges that must be read, adding 'down' nodes to `subtree`.
  while (height > 0) {
    node = edge->btree();
    index_[height] = static_cast<uint8_t>(index);
    node_[--height] = node;
    index = node->begin();
    edge = node->Edge(index);

    if (length != 0) {
      CordRepBtree* right = CordRepBtree::New(height);
      right->length = length;
      subtree->edges_[subtree_end++] = right;
      subtree->set_end(subtree_end);
      subtree = right;
      subtree_end = 0;
      while (length >= edge->length) {
        subtree->edges_[subtree_end++] = CordRep::Ref(edge);
        length -= edge->length;
        edge = node->Edge(++index);
      }
    }
  }
  // Add any (partial) edge still remaining at the leaf level.
  if (length != 0) {
    subtree->edges_[subtree_end++] = Substring(edge, 0, length);
  }
  subtree->set_end(subtree_end);
  index_[0] = static_cast<uint8_t>(index);
  return {tree, length};
}